

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::DataSet(DataSet *this,string *filepath,ReadInfo *read_info)

{
  ReadInfo *read_info_local;
  string *filepath_local;
  DataSet *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_labels);
  Matrix<double>::Matrix(&this->m_matrix);
  load(this,filepath,read_info);
  return;
}

Assistant:

DataSet::DataSet(const std::string& filepath, const ReadInfo& read_info){
    load(filepath, read_info);
}